

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function_simd.cpp
# Opt level: O1

void sse::Invert(uint32_t rowSizeIn,uint32_t rowSizeOut,uint8_t *inY,uint8_t *outY,uint8_t *outYEnd,
                uint32_t simdWidth,uint32_t totalSimdWidth,uint32_t nonSimdWidth)

{
  undefined1 auVar1 [16];
  uint8_t *puVar2;
  uint8_t *puVar3;
  long lVar4;
  ulong uVar5;
  undefined1 in_ZMM0 [64];
  
  if (outY != outYEnd) {
    puVar3 = outY + totalSimdWidth;
    puVar2 = inY + totalSimdWidth;
    auVar1 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
    do {
      if (simdWidth != 0) {
        lVar4 = 0;
        do {
          *(undefined1 (*) [16])(outY + lVar4) = auVar1 ^ *(undefined1 (*) [16])(inY + lVar4);
          lVar4 = lVar4 + 0x10;
        } while ((ulong)simdWidth << 4 != lVar4);
      }
      if (nonSimdWidth != 0) {
        uVar5 = 0;
        do {
          puVar3[uVar5] = ~puVar2[uVar5];
          uVar5 = uVar5 + 1;
        } while (nonSimdWidth != uVar5);
      }
      outY = outY + rowSizeOut;
      inY = inY + rowSizeIn;
      puVar3 = puVar3 + rowSizeOut;
      puVar2 = puVar2 + rowSizeIn;
    } while (outY != outYEnd);
  }
  return;
}

Assistant:

void Invert( uint32_t rowSizeIn, uint32_t rowSizeOut, const uint8_t * inY, uint8_t * outY, const uint8_t * outYEnd,
                 uint32_t simdWidth, uint32_t totalSimdWidth, uint32_t nonSimdWidth )
    {
        const char maskValue = static_cast<char>(0xffu);
        const simd mask = _mm_set_epi8( maskValue, maskValue, maskValue, maskValue, maskValue, maskValue, maskValue, maskValue,
                                        maskValue, maskValue, maskValue, maskValue, maskValue, maskValue, maskValue, maskValue );

        for( ; outY != outYEnd; outY += rowSizeOut, inY += rowSizeIn ) {
            const simd * src1 = reinterpret_cast <const simd*> (inY);
            simd       * dst  = reinterpret_cast <simd*> (outY);

            const simd * src1End = src1 + simdWidth;

            for( ; src1 != src1End; ++src1, ++dst )
                _mm_storeu_si128( dst, _mm_andnot_si128( _mm_loadu_si128( src1 ), mask ) );

            if( nonSimdWidth > 0 ) {
                const uint8_t * inX  = inY  + totalSimdWidth;
                uint8_t       * outX = outY + totalSimdWidth;

                const uint8_t * outXEnd = outX + nonSimdWidth;

                for( ; outX != outXEnd; ++outX, ++inX )
                    (*outX) = ~(*inX);
            }
        }
    }